

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int __thiscall despot::Parser::NumStates(Parser *this)

{
  int iVar1;
  size_type sVar2;
  reference this_00;
  double dVar3;
  int local_20;
  int local_1c;
  int i;
  int num_states;
  Parser *this_local;
  
  dVar3 = LogNumStates(this);
  if (dVar3 <= 30.0) {
    local_1c = 1;
    local_20 = 0;
    while( true ) {
      sVar2 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size
                        (&this->curr_state_vars_);
      if (sVar2 <= (ulong)(long)local_20) break;
      this_00 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                          (&this->curr_state_vars_,(long)local_20);
      iVar1 = Variable::Size((Variable *)this_00);
      local_1c = iVar1 * local_1c;
      local_20 = local_20 + 1;
    }
    this_local._4_4_ = local_1c;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int Parser::NumStates() const {
	if (LogNumStates() > 30) {
		return -1;
	} else {
		int num_states = 1;
		for (int i = 0; i < curr_state_vars_.size(); i++) {
			num_states *= curr_state_vars_[i].Size();
		}

		return num_states;
	}
}